

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::IODeclaration::IODeclaration(IODeclaration *this,CodeLocation *l)

{
  CodeLocation local_28;
  CodeLocation *local_18;
  CodeLocation *l_local;
  IODeclaration *this_local;
  
  local_18 = l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_28,l);
  Object::Object(&this->super_Object,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__IODeclaration_006413c8;
  Identifier::Identifier(&this->name);
  this->index = 0;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::vector(&this->dataTypes);
  std::optional<unsigned_int>::optional(&this->arraySize);
  Annotation::Annotation(&this->annotation);
  return;
}

Assistant:

IODeclaration (CodeLocation l) : Object (std::move (l)) {}